

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::CreateLinkLibs
          (cmMakefileTargetGenerator *this,cmLinkLineComputer *linkLineComputer,string *linkLibs,
          bool useResponseFile,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends,string *linkLanguage,ResponseFlagFor responseMode)

{
  cmGeneratorTarget *this_00;
  cmComputeLinkInformation *pcli;
  long lVar1;
  char *__s;
  string_view source;
  string responseFlag;
  string responseFileName;
  string link_rsp;
  string responseLang;
  string linkPath;
  string frameworkPath;
  string local_70;
  string local_50;
  
  frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
  frameworkPath._M_string_length = 0;
  linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
  linkPath._M_string_length = 0;
  frameworkPath.field_2._M_local_buf[0] = '\0';
  linkPath.field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_(&responseFlag,this);
  pcli = cmGeneratorTarget::GetLinkInformation(this_00,&responseFlag);
  std::__cxx11::string::~string((string *)&responseFlag);
  cmLocalGenerator::OutputLinkLibraries
            ((cmLocalGenerator *)this->LocalGenerator,pcli,linkLineComputer,linkLibs,&frameworkPath,
             &linkPath);
  std::operator+(&responseFileName,&frameworkPath,&linkPath);
  std::operator+(&responseFlag,&responseFileName,linkLibs);
  std::__cxx11::string::operator=((string *)linkLibs,(string *)&responseFlag);
  std::__cxx11::string::~string((string *)&responseFlag);
  std::__cxx11::string::~string((string *)&responseFileName);
  if (useResponseFile) {
    lVar1 = std::__cxx11::string::find_first_not_of((char)linkLibs,0x20);
    if (lVar1 != -1) {
      GetResponseFlag_abi_cxx11_(&responseFlag,this,responseMode);
      __s = "deviceLinkLibs.rsp";
      if (responseMode == Link) {
        __s = "linkLibs.rsp";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&responseFileName,__s,(allocator<char> *)&responseLang);
      if (responseMode == Link) {
        std::__cxx11::string::string((string *)&responseLang,(string *)linkLanguage);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&responseLang,"CUDA",(allocator<char> *)&link_rsp);
      }
      CreateResponseFile(&link_rsp,this,&responseFileName,linkLibs,makefile_depends,&responseLang);
      source._M_str = link_rsp._M_dataplus._M_p;
      source._M_len = link_rsp._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_70,(cmOutputConverter *)this->LocalGenerator,source,SHELL,false);
      cmStrCat<std::__cxx11::string,std::__cxx11::string>(&local_50,&responseFlag,&local_70);
      std::__cxx11::string::operator=((string *)linkLibs,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&link_rsp);
      std::__cxx11::string::~string((string *)&responseLang);
      std::__cxx11::string::~string((string *)&responseFileName);
      std::__cxx11::string::~string((string *)&responseFlag);
    }
  }
  std::__cxx11::string::~string((string *)&linkPath);
  std::__cxx11::string::~string((string *)&frameworkPath);
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateLinkLibs(
  cmLinkLineComputer* linkLineComputer, std::string& linkLibs,
  bool useResponseFile, std::vector<std::string>& makefile_depends,
  std::string const& linkLanguage, ResponseFlagFor responseMode)
{
  std::string frameworkPath;
  std::string linkPath;
  cmComputeLinkInformation* pcli =
    this->GeneratorTarget->GetLinkInformation(this->GetConfigName());
  this->LocalGenerator->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                            frameworkPath, linkPath);
  linkLibs = frameworkPath + linkPath + linkLibs;

  if (useResponseFile &&
      linkLibs.find_first_not_of(' ') != std::string::npos) {
    // Lookup the response file reference flag.
    std::string responseFlag = this->GetResponseFlag(responseMode);

    // Create this response file.
    std::string const responseFileName =
      (responseMode == Link) ? "linkLibs.rsp" : "deviceLinkLibs.rsp";
    std::string const responseLang =
      (responseMode == Link) ? linkLanguage : "CUDA";
    std::string link_rsp = this->CreateResponseFile(
      responseFileName, linkLibs, makefile_depends, responseLang);

    // Reference the response file.
    linkLibs = cmStrCat(std::move(responseFlag),
                        this->LocalGenerator->ConvertToOutputFormat(
                          std::move(link_rsp), cmOutputConverter::SHELL));
  }
}